

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapBiomeEdge(Layer *l,int *out,int x,int z,int w,int h)

{
  int id1;
  int id1_00;
  int id1_01;
  int mc;
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  int *local_90;
  long local_80;
  
  mc = (int)l->mc;
  iVar1 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar1 == 0) {
    if (0 < h) {
      lVar3 = (long)w;
      piVar4 = out + lVar3 * 2 + 5;
      piVar8 = out + lVar3 + 4;
      local_80 = 0;
      lVar6 = 0;
      piVar7 = out;
      local_90 = out;
      do {
        if (0 < w) {
          lVar5 = 0;
          lVar9 = local_80;
          do {
            iVar1 = piVar8[lVar5 + -2];
            iVar2 = piVar8[lVar5 + -1];
            id1 = piVar7[lVar5 + 1];
            id1_00 = piVar8[lVar5];
            id1_01 = piVar4[lVar5];
            if (iVar2 == 2) {
              if ((((id1 == 0xc) || (id1_00 == 0xc)) || (iVar1 == 0xc)) || (id1_01 == 0xc)) {
                local_90[lVar5] = 0x22;
              }
              else {
                local_90[lVar5] = 2;
              }
            }
            else if (iVar2 == 6) {
              if ((((id1 == 2) || (id1_00 == 2)) ||
                  ((iVar1 == 2 || ((id1_01 == 2 || (id1 == 0x1e)))))) ||
                 ((id1_00 == 0x1e ||
                  (((((iVar1 == 0x1e || (id1_01 == 0x1e)) || (id1 == 0xc)) ||
                    ((id1_00 == 0xc || (iVar1 == 0xc)))) || (id1_01 == 0xc)))))) {
                local_90[lVar5] = 1;
              }
              else if (((id1 == 0x15) || (id1_00 == 0x15)) ||
                      (((iVar1 == 0x15 || (((id1_01 == 0x15 || (id1 == 0xa8)) || (id1_00 == 0xa8))))
                       || ((iVar1 == 0xa8 || (id1_01 == 0xa8)))))) {
                local_90[lVar5] = 0x17;
              }
              else {
                local_90[lVar5] = 6;
              }
            }
            else {
              if (iVar2 == 0x20) {
                iVar2 = areSimilar(mc,id1,0x20);
                if (((iVar2 != 0) && (iVar2 = areSimilar(mc,id1_00,0x20), iVar2 != 0)) &&
                   (iVar1 = areSimilar(mc,iVar1,0x20), iVar1 != 0)) {
                  iVar1 = 0x20;
                  iVar2 = areSimilar(mc,id1_01,0x20);
                  if (iVar2 != 0) goto LAB_001086ac;
                }
                iVar1 = 5;
              }
              else {
                if (iVar2 == 0x27) {
                  iVar2 = areSimilar(mc,id1,0x27);
                  if (((iVar2 != 0) && (iVar2 = areSimilar(mc,id1_00,0x27), iVar2 != 0)) &&
                     (iVar1 = areSimilar(mc,iVar1,0x27), iVar1 != 0)) {
                    iVar1 = 0x27;
LAB_0010864b:
                    iVar2 = areSimilar(mc,id1_01,iVar1);
                    if (iVar2 != 0) goto LAB_001086ac;
                  }
                }
                else {
                  if (iVar2 != 0x26) {
                    local_90[lVar5] = iVar2;
                    goto LAB_0010871e;
                  }
                  iVar2 = areSimilar(mc,id1,0x26);
                  if (((iVar2 != 0) && (iVar2 = areSimilar(mc,id1_00,0x26), iVar2 != 0)) &&
                     (iVar1 = areSimilar(mc,iVar1,0x26), iVar1 != 0)) {
                    iVar1 = 0x26;
                    goto LAB_0010864b;
                  }
                }
                iVar1 = 0x25;
              }
LAB_001086ac:
              *(int *)((long)out + (lVar9 >> 0x1e)) = iVar1;
            }
LAB_0010871e:
            lVar5 = lVar5 + 1;
            lVar9 = lVar9 + 0x100000000;
          } while (lVar3 != lVar5);
        }
        lVar6 = lVar6 + 1;
        local_80 = local_80 + (lVar3 << 0x20);
        local_90 = local_90 + lVar3;
        piVar4 = piVar4 + lVar3 + 2;
        piVar7 = piVar7 + lVar3 + 2;
        piVar8 = piVar8 + lVar3 + 2;
      } while (lVar6 != h);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mapBiomeEdge(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;
    int mc = l->mc;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        for (i = 0; i < w; i++)
        {
            int v11 = vz1[i+1];
            int v10 = vz0[i+1];
            int v21 = vz1[i+2];
            int v01 = vz1[i+0];
            int v12 = vz2[i+1];

            if (!replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, wooded_badlands_plateau, badlands) &&
                !replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, badlands_plateau, badlands) &&
                !replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, giant_tree_taiga, taiga))
            {
                if (v11 == desert)
                {
                    if (!isAny4(snowy_tundra, v10, v21, v01, v12))
                    {
                        out[i + j*w] = v11;
                    }
                    else
                    {
                        out[i + j*w] = wooded_mountains;
                    }
                }
                else if (v11 == swamp)
                {
                    if (!isAny4(desert, v10, v21, v01, v12) &&
                        !isAny4(snowy_taiga, v10, v21, v01, v12) &&
                        !isAny4(snowy_tundra, v10, v21, v01, v12))
                    {
                        if (!isAny4(jungle, v10, v21, v01, v12) &&
                            !isAny4(bamboo_jungle, v10, v21, v01, v12))
                            out[i + j*w] = v11;
                        else
                            out[i + j*w] = jungle_edge;
                    }
                    else
                    {
                        out[i + j*w] = plains;
                    }
                }
                else
                {
                    out[i + j*w] = v11;
                }
            }
        }
    }

    return 0;
}